

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

void __thiscall LeakTest2_Test7_Test::LeakTest2_Test7_Test(LeakTest2_Test7_Test *this)

{
  LeakTest2_Test7_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__LeakTest2_Test7_Test_0023e8a8;
  return;
}

Assistant:

TEST(LeakTest2, Test7){
    CtorTotCounterVS = 0;
    CtorGoodCounterVS = 0;
    CtorBadCounterVS = 0;
    GoodClassVS::counter = 0;
    {
        Infector::Container ioc;
        ioc.bindSingleAsNothing<BadClassVS>();
        ioc.bindSingleAsNothing<GoodClassVS>();
        ioc.bindSingleAsNothing<GBVS>();
        ioc.bindSingleAsNothing<BGVS>();
        ioc.wire<BadClassVS>();
        ioc.wire<GoodClassVS>();
        // C++ make no assumption about evaluation order of parameters
        // so I must test both orders.. and there's no guarantee that
        // evaluation order will be the same between 2 calls, so manual
        // attention must be paid here.
        ioc.wire<BGVS       ,BadClassVS,GoodClassVS>();
        ioc.wire<GBVS       ,GoodClassVS,BadClassVS>();
        //std::cout<<"\n3 CONSTRUCTORS CALLS MUST BE DISPLAYED:\n"<<std::endl;
        try{
        auto a = ioc.buildSingle<BGVS>();
        }catch(std::exception &ex){
            std::cout<<"ex 1"<<std::endl;
            std::cout<<ex.what()<<std::endl;
        }
        //std::cout<<"2nd call"<<std::endl;
        try{
        auto b = ioc.buildSingle<GBVS>();
        }catch(std::exception &ex){
            std::cout<<"ex 2"<<std::endl;
            std::cout<<ex.what()<<std::endl;
        }
    }
    EXPECT_EQ(0, GoodClassVS::counter); // TEST MEMORY LEAK
    EXPECT_EQ(3, CtorTotCounterVS);
    EXPECT_TRUE(CtorBadCounterVS > 0 && CtorGoodCounterVS > 0 );
    GoodClassVS::counter = 0;
    CtorTotCounterVS = 0;
    CtorBadCounterVS = 0;
    CtorGoodCounterVS = 0;
}